

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cc
# Opt level: O0

NativeCallback * __thiscall flow::Runtime::registerHandler(Runtime *this,string *name)

{
  size_type sVar1;
  reference this_00;
  type pNVar2;
  Runtime *local_28;
  value_type local_20;
  undefined1 local_18 [8];
  string *name_local;
  Runtime *this_local;
  
  local_28 = this;
  local_18 = (undefined1  [8])name;
  name_local = (string *)this;
  std::make_unique<flow::NativeCallback,flow::Runtime*,std::__cxx11::string_const&>
            ((Runtime **)&local_20,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  std::
  vector<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>
  ::push_back(&this->builtins_,&local_20);
  std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>::~unique_ptr
            (&local_20);
  sVar1 = std::
          vector<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>
          ::size(&this->builtins_);
  this_00 = std::
            vector<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>,_std::allocator<std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>_>_>
            ::operator[](&this->builtins_,sVar1 - 1);
  pNVar2 = std::unique_ptr<flow::NativeCallback,_std::default_delete<flow::NativeCallback>_>::
           operator*(this_00);
  return pNVar2;
}

Assistant:

NativeCallback& Runtime::registerHandler(const std::string& name) {
  builtins_.push_back(std::make_unique<NativeCallback>(this, name));
  return *builtins_[builtins_.size() - 1];
}